

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

void __thiscall
proto2_unittest::TestAllTypes::set_allocated_optional_nested_message
          (TestAllTypes *this,TestAllTypes_NestedMessage *value)

{
  TestAllTypes_NestedMessage *pTVar1;
  uint uVar2;
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  if ((message_arena == (Arena *)0x0) &&
     (pTVar1 = (this->field_0)._impl_.optional_nested_message_,
     pTVar1 != (TestAllTypes_NestedMessage *)0x0)) {
    (*(pTVar1->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  if (value == (TestAllTypes_NestedMessage *)0x0) {
    uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0] & 0xffffffdf;
    value = (TestAllTypes_NestedMessage *)0x0;
  }
  else {
    submessage_arena = (Arena *)(value->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      value = (TestAllTypes_NestedMessage *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (message_arena,(MessageLite *)value,submessage_arena);
    }
    uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0] | 0x20;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = uVar2;
  (this->field_0)._impl_.optional_nested_message_ = value;
  return;
}

Assistant:

inline void TestAllTypes::set_allocated_optional_nested_message(::proto2_unittest::TestAllTypes_NestedMessage* PROTOBUF_NULLABLE value) {
  ::google::protobuf::Arena* message_arena = GetArena();
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (message_arena == nullptr) {
    delete reinterpret_cast<::google::protobuf::MessageLite*>(_impl_.optional_nested_message_);
  }

  if (value != nullptr) {
    ::google::protobuf::Arena* submessage_arena = value->GetArena();
    if (message_arena != submessage_arena) {
      value = ::google::protobuf::internal::GetOwnedMessage(message_arena, value, submessage_arena);
    }
    _impl_._has_bits_[0] |= 0x00000020u;
  } else {
    _impl_._has_bits_[0] &= ~0x00000020u;
  }

  _impl_.optional_nested_message_ = reinterpret_cast<::proto2_unittest::TestAllTypes_NestedMessage*>(value);
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.TestAllTypes.optional_nested_message)
}